

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall am_CList::Add_Update(am_CList *this,CItem *item)

{
  if (item != (CItem *)0x0) {
    Remove_Inv(this,item);
    if (this->head == (CItem *)0x0) {
      (item->field_1).prev = (CItem *)0x0;
    }
    else {
      item->field_1 = this->head->field_1;
      this = (am_CList *)&this->head->field_1;
    }
    *this = (am_CList)item;
  }
  return;
}

Assistant:

void
am_CList::Add_Update(CItem *item)
{
  if (item) {
    Remove_Inv(item);
    if (head) {
      item->next_invalid = head->next_invalid;
      head->next_invalid = item;
    } else {
      item->next_invalid = head;
      head = item;
    }
  }
}